

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

Boxed_Value
chaiscript::dispatch::detail::Do_Call<std::shared_ptr<unsigned_short>>::
go<std::shared_ptr<unsigned_short>(),chaiscript::dispatch::detail::Constructor<unsigned_short>>
          (Constructor<unsigned_short> *fun,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
          Type_Conversions_State *t_conversions)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Boxed_Value BVar1;
  shared_ptr<unsigned_short> *in_stack_ffffffffffffff98;
  Function_Signature<std::shared_ptr<unsigned_short>_()> *in_stack_ffffffffffffffb8;
  Constructor<unsigned_short> local_30 [48];
  
  call_func<chaiscript::dispatch::detail::Constructor<unsigned_short>,std::shared_ptr<unsigned_short>>
            (in_stack_ffffffffffffffb8,local_30,
             (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)in_RDI,
             (Type_Conversions_State *)in_RDI);
  Handle_Return<std::shared_ptr<unsigned_short>_>::handle(in_stack_ffffffffffffff98);
  std::shared_ptr<unsigned_short>::~shared_ptr((shared_ptr<unsigned_short> *)0x3ad643);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value go(const Callable &fun, const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
          {
            return Handle_Return<Ret>::handle(call_func(Function_Signature<Signature>(), fun, params, t_conversions));
          }